

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_stream_info *si;
  uint64_t uVar2;
  long lVar3;
  void *pvVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  uLong uVar10;
  int64_t iVar11;
  uint32_t *puVar12;
  archive_string_conv *paVar13;
  int *piVar14;
  uchar *puVar15;
  char *pcVar16;
  char *pcVar17;
  _7z_folder *p_Var18;
  uint uVar19;
  uint64_t *puVar20;
  ulong uVar21;
  char *pcVar22;
  long lVar23;
  _7z_folder *p_Var24;
  char *p;
  uint64_t *puVar25;
  bool bVar26;
  int64_t offset;
  size_t size;
  _7z_header_info header;
  long local_68;
  ulong local_60;
  _7z_header_info local_58;
  
  si = (_7z_stream_info *)a->format->data;
  if (*(int *)&si[199].pi.digest.digests == -1) {
    *(undefined4 *)&si[199].pi.digest.digests = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    local_58.emptyFileBools = (uchar *)0x0;
    local_58.antiBools = (uchar *)0x0;
    local_58.dataIndex = 0;
    local_58.emptyStreamBools = (uchar *)0x0;
    local_58.attrBools = (uchar *)0x0;
    piVar14 = (int *)__archive_read_ahead(a,0x20,&local_68);
    iVar7 = -0x1e;
    if (piVar14 == (int *)0x0) {
LAB_003f81c4:
      bVar26 = false;
    }
    else {
      if ((((char)*piVar14 == 'M') && (*(char *)((long)piVar14 + 1) == 'Z')) ||
         (*piVar14 == 0x464c457f)) {
        if (local_68 < 0x27001) {
          iVar11 = __archive_read_seek(a,0x27000,0);
          if (iVar11 < 0) goto LAB_003f81c4;
        }
        else {
          __archive_read_consume(a,0x27000);
        }
        lVar23 = 0;
        uVar21 = 1;
        do {
          while (pcVar16 = (char *)__archive_read_ahead(a,uVar21,(ssize_t *)&local_60),
                pcVar16 == (char *)0x0) {
            if (uVar21 < 0x80) goto LAB_003f80f4;
            uVar8 = uVar21 >> 1;
LAB_003f80a2:
            uVar21 = uVar8;
            if (0x39000 < uVar8 + lVar23) goto LAB_003f80f4;
          }
          uVar8 = 0x1000;
          if ((long)local_60 < 6) goto LAB_003f80a2;
          pcVar17 = pcVar16;
          if (0x20 < local_60) {
            pcVar22 = pcVar16 + local_60;
            p = pcVar16;
            do {
              uVar19 = check_7zip_header_in_sfx(p);
              if (uVar19 == 0) {
                pvVar4 = a->format->data;
                __archive_read_consume(a,(long)p - (long)pcVar16);
                *(long *)((long)pvVar4 + 0x88) = ((long)p - (long)pcVar16) + lVar23 + 0x27000;
                piVar14 = (int *)__archive_read_ahead(a,0x20,&local_68);
                iVar7 = -0x1e;
                if (piVar14 == (int *)0x0) goto LAB_003f81c4;
                goto LAB_003f7fc6;
              }
              pcVar17 = p + uVar19;
              pcVar9 = p + (ulong)uVar19 + 0x20;
              p = pcVar17;
            } while (pcVar9 < pcVar22);
          }
          __archive_read_consume(a,(long)pcVar17 - (long)pcVar16);
          lVar23 = lVar23 + ((long)pcVar17 - (long)pcVar16);
          if (uVar21 == 1) {
            uVar21 = 0x1000;
          }
        } while (lVar23 + uVar21 < 0x39001);
LAB_003f80f4:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
        iVar7 = -0x1e;
        goto LAB_003f81c4;
      }
LAB_003f7fc6:
      iVar7 = -0x1e;
      ppuVar1 = &si[1].pi.digest.digests;
      *ppuVar1 = *ppuVar1 + 8;
      if ((short)piVar14[1] != 0x1c27 || *piVar14 != -0x504385c9) {
        pcVar16 = "Not 7-Zip archive file";
LAB_003f81b1:
        archive_set_error(&a->archive,-1,pcVar16);
        goto LAB_003f81c4;
      }
      uVar10 = cm_zlib_crc32(0,(uchar *)(piVar14 + 3),0x14);
      if (uVar10 != (uint)piVar14[2]) {
        pcVar16 = "Header CRC error";
        goto LAB_003f81b1;
      }
      uVar2 = *(uint64_t *)(piVar14 + 5);
      if (uVar2 == 0) {
        iVar7 = 1;
        goto LAB_003f81c4;
      }
      if ((long)((ulong)(uint)piVar14[4] << 0x20) < 0) {
        pcVar16 = "Malformed 7-Zip archive";
        iVar7 = -1;
LAB_003f86e8:
        archive_set_error(&a->archive,iVar7,pcVar16);
LAB_003f86f4:
        bVar26 = false;
        iVar7 = -0x1e;
      }
      else {
        puVar20 = (uint64_t *)CONCAT44(piVar14[4],piVar14[3]);
        puVar25 = (uint64_t *)(ulong)(uint)piVar14[7];
        __archive_read_consume(a,0x20);
        if (puVar20 != (uint64_t *)0x0) {
          if ((long)puVar20 <= local_68) {
            __archive_read_consume(a,(int64_t)puVar20);
            goto LAB_003f860b;
          }
          iVar11 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar20,0);
          if (-1 < iVar11) goto LAB_003f860b;
          goto LAB_003f86f4;
        }
LAB_003f860b:
        si[2].pi.positions = puVar20;
        si[1].pi.digest.defineds = (uchar *)puVar20;
        si[1].pi.numPackStreams = uVar2;
        si[1].pi.sizes = (uint64_t *)0x0;
        si[1].pi.pos = 1;
        *(undefined4 *)&si[199].pi.digest.digests = 0;
        puVar15 = header_bytes(a,1);
        if (puVar15 == (uchar *)0x0) {
          pcVar16 = "Truncated 7-Zip file body";
          iVar7 = 0x54;
          goto LAB_003f86e8;
        }
        if (*puVar15 == '\x01') {
          bVar26 = false;
LAB_003f8709:
          piVar14 = __errno_location();
          *piVar14 = 0;
          iVar7 = read_Header(a,&local_58,*(int *)((long)&si[1].pi.pos + 4));
          if (iVar7 < 0) {
            if (*piVar14 == 0xc) {
              pcVar16 = "Couldn\'t allocate memory";
            }
            else {
              pcVar16 = "Damaged 7-Zip archive";
            }
          }
          else {
            puVar15 = header_bytes(a,1);
            if ((puVar15 != (uchar *)0x0) && (*puVar15 == '\0')) {
              if ((!bVar26) && (si[1].pi.sizes != puVar25)) {
                archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
                goto LAB_003f86f4;
              }
              iVar7 = 0;
              si[2].pi.digest.digests = (uint32_t *)0x0;
              si[2].ss.unpackSizes = (uint64_t *)0x0;
              *(undefined4 *)&si[1].pi.pos = 0;
              si[2].ci.folders = (_7z_folder *)0x0;
              si[2].ci.dataStreamIndex = 0;
              bVar26 = true;
              goto LAB_003f81c9;
            }
            pcVar16 = "Malformed 7-Zip archive";
          }
          archive_set_error(&a->archive,-1,pcVar16);
          goto LAB_003f86f4;
        }
        iVar7 = -0x1e;
        if (*puVar15 == '\x17') {
          iVar6 = decode_encoded_header_info(a,si);
          bVar26 = true;
          if (iVar6 == 0) {
            if (si[1].pi.sizes == puVar25) {
              p_Var24 = (si->ci).folders;
              bVar26 = p_Var24->digest_defined != '\0';
              if (bVar26) {
                puVar25 = (uint64_t *)(ulong)p_Var24->digest;
              }
              if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
                read_consume(a);
                p_Var24 = (si->ci).folders;
              }
              iVar6 = setup_decode_folder(a,p_Var24,1);
              if (iVar6 == 0) {
                si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
                iVar6 = seek_pack(a);
              }
            }
            else {
              iVar6 = -1;
              archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
              bVar26 = true;
            }
          }
          free_StreamsInfo(si);
          (si->ss).unpackSizes = (uint64_t *)0x0;
          (si->ss).digestsDefined = (uchar *)0x0;
          (si->ci).dataStreamIndex = 0;
          (si->ss).unpack_streams = 0;
          (si->ci).numFolders = 0;
          (si->ci).folders = (_7z_folder *)0x0;
          (si->pi).digest.digests = (uint32_t *)0x0;
          (si->pi).positions = (uint64_t *)0x0;
          (si->pi).sizes = (uint64_t *)0x0;
          (si->pi).digest.defineds = (uchar *)0x0;
          (si->pi).pos = 0;
          (si->pi).numPackStreams = 0;
          (si->ss).digests = (uint32_t *)0x0;
          if (-1 < iVar6) {
            *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
            si[1].pi.sizes = (uint64_t *)0x0;
            bVar26 = !bVar26;
            goto LAB_003f8709;
          }
          bVar26 = false;
        }
        else {
          bVar26 = false;
          archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
        }
      }
    }
LAB_003f81c9:
    free(local_58.emptyStreamBools);
    free(local_58.emptyFileBools);
    free(local_58.antiBools);
    free(local_58.attrBools);
    if (!bVar26) {
      return iVar7;
    }
    puVar20 = (uint64_t *)si[1].ci.numFolders;
    p_Var24 = si[1].ci.folders;
    si[1].pi.positions = puVar20;
    si[1].ci.dataStreamIndex = (uint64_t)p_Var24;
  }
  else {
    puVar20 = si[1].pi.positions;
    p_Var24 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x58);
    si[1].ci.dataStreamIndex = (uint64_t)p_Var24;
  }
  if (p_Var24 == (_7z_folder *)0x0 || puVar20 == (uint64_t *)0x0) {
    return 1;
  }
  si[1].pi.positions = (uint64_t *)((long)puVar20 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar12 = (uint32_t *)cm_zlib_crc32(0,(uchar *)0x0,0);
  si[1].ss.digests = puVar12;
  if (si[0xc6].ci.dataStreamIndex == 0) {
    paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
    si[0xc6].ci.dataStreamIndex = (uint64_t)paVar13;
    if (paVar13 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  uVar21 = (ulong)(uint)p_Var24->numBindPairs;
  if (((uVar21 < (si->ci).numFolders) && (p_Var18 = (si->ci).folders, p_Var18 != (_7z_folder *)0x0))
     && (p_Var18 = p_Var18 + uVar21, p_Var18->numCoders != 0)) {
    lVar23 = 0;
    uVar21 = 0;
    do {
      lVar3 = *(long *)((long)&p_Var18->coders->codec + lVar23);
      if (((lVar3 == 0x6f10101) || (lVar3 == 0x6f10701)) || (lVar3 == 0x6f10303)) {
        archive_entry_set_is_data_encrypted(entry,'\x01');
        *(undefined4 *)&si[199].pi.digest.digests = 1;
      }
      uVar21 = uVar21 + 1;
      lVar23 = lVar23 + 0x28;
    } while (uVar21 < p_Var18->numCoders);
  }
  if (*(int *)&si[199].pi.digest.digests == -1) {
    *(undefined4 *)&si[199].pi.digest.digests = 0;
  }
  wVar5 = _archive_entry_copy_pathname_l
                    (entry,(char *)p_Var24->coders,p_Var24->numCoders,
                     (archive_string_conv *)si[0xc6].ci.dataStreamIndex);
  if (wVar5 == L'\0') {
    iVar7 = 0;
  }
  else {
    piVar14 = __errno_location();
    if (*piVar14 == 0xc) {
      pcVar16 = "Can\'t allocate memory for Pathname";
LAB_003f833f:
      archive_set_error(&a->archive,0xc,pcVar16);
      return -0x1e;
    }
    pcVar16 = archive_string_conversion_charset_name
                        ((archive_string_conv *)si[0xc6].ci.dataStreamIndex);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                      pcVar16);
    iVar7 = -0x14;
  }
  archive_entry_set_mode(entry,(mode_t)p_Var24->numUnpackStreams);
  uVar19 = *(uint *)&p_Var24->bindPairs;
  if ((uVar19 & 1) != 0) {
    archive_entry_set_mtime(entry,p_Var24->numPackedStreams,p_Var24->numOutStreams);
    uVar19 = *(uint *)&p_Var24->bindPairs;
  }
  if ((uVar19 & 4) != 0) {
    lVar23._0_1_ = p_Var24->digest_defined;
    lVar23._1_3_ = *(undefined3 *)&p_Var24->field_0x49;
    lVar23._4_4_ = p_Var24->digest;
    archive_entry_set_ctime(entry,p_Var24->numInStreams,lVar23);
    uVar19 = *(uint *)&p_Var24->bindPairs;
  }
  if ((uVar19 & 2) != 0) {
    archive_entry_set_atime(entry,(time_t)p_Var24->packedStreams,(long)p_Var24->unPackSize);
  }
  uVar21 = (ulong)*(uint *)((long)&p_Var24->numBindPairs + 4);
  if (uVar21 == 0xffffffff) {
    puVar15 = (uchar *)0x0;
  }
  else {
    puVar15 = (uchar *)(si->ss).unpackSizes[uVar21];
  }
  si[1].ss.digestsDefined = puVar15;
  archive_entry_set_size(entry,(la_int64_t)puVar15);
  if (si[1].ss.digestsDefined == (uchar *)0x0) {
    *(undefined1 *)&si[2].pi.pos = 1;
    if ((p_Var24->numUnpackStreams & 0xf000) != 0xa000) goto LAB_003f851a;
    pcVar16 = (char *)0x0;
LAB_003f84e8:
    uVar19 = (uint)p_Var24->numUnpackStreams & 0xffff0fff | 0x8000;
    *(uint *)&p_Var24->numUnpackStreams = uVar19;
    archive_entry_set_mode(entry,uVar19);
  }
  else {
    if ((p_Var24->numUnpackStreams & 0xf000) != 0xa000) goto LAB_003f851a;
    lVar23 = 0;
    pcVar17 = (char *)0x0;
    do {
      iVar6 = archive_read_format_7zip_read_data(a,(void **)&local_58,&local_60,&local_68);
      uVar21 = local_60;
      if (iVar6 < -0x14) {
        free(pcVar17);
        return iVar6;
      }
      pcVar16 = (char *)realloc(pcVar17,lVar23 + local_60 + 1);
      if (pcVar16 == (char *)0x0) {
        free(pcVar17);
        pcVar16 = "Can\'t allocate memory for Symname";
        goto LAB_003f833f;
      }
      memcpy(pcVar16 + lVar23,(void *)local_58.dataIndex,uVar21);
      lVar23 = lVar23 + uVar21;
      pcVar17 = pcVar16;
    } while (si[1].ss.digestsDefined != (uchar *)0x0);
    if (lVar23 == 0) goto LAB_003f84e8;
    pcVar16[lVar23] = '\0';
    archive_entry_copy_symlink(entry,pcVar16);
  }
  free(pcVar16);
  archive_entry_set_size(entry,0);
LAB_003f851a:
  *(undefined2 *)((long)&si[0xc6].ss.unpack_streams + 4) = 0x70;
  *(undefined4 *)&si[0xc6].ss.unpack_streams = 0x695a2d37;
  (a->archive).archive_format_name = (char *)&si[0xc6].ss;
  return iVar7;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}